

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmio.c
# Opt level: O0

int mm_read_unsymmetric_sparse(char *fname,int *M_,int *N_,int *nz_,double **val_,int **I_,int **J_)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  int *piVar3;
  int *piVar4;
  double *pdVar5;
  int *J;
  int *I;
  double *val;
  int local_58;
  int i;
  int nz;
  int N;
  int M;
  MM_typecode matcode;
  FILE *f;
  int **I__local;
  double **val__local;
  int *nz__local;
  int *N__local;
  int *M__local;
  char *fname_local;
  
  _M = fopen(fname,"r");
  if (_M == (FILE *)0x0) {
    fname_local._4_4_ = -1;
  }
  else {
    iVar1 = mm_read_banner((FILE *)_M,(MM_typecode *)&N);
    if (iVar1 == 0) {
      if (((N._2_1_ == 'R') && ((char)N == 'M')) && (N._1_1_ == 'C')) {
        iVar1 = mm_read_mtx_crd_size((FILE *)_M,&nz,&i,&local_58);
        if (iVar1 == 0) {
          *M_ = nz;
          *N_ = i;
          *nz_ = local_58;
          piVar3 = (int *)malloc((long)local_58 << 2);
          piVar4 = (int *)malloc((long)local_58 << 2);
          pdVar5 = (double *)malloc((long)local_58 << 3);
          *val_ = pdVar5;
          *I_ = piVar3;
          *J_ = piVar4;
          for (val._4_4_ = 0; val._4_4_ < local_58; val._4_4_ = val._4_4_ + 1) {
            __isoc99_fscanf(_M,"%d %d %lg\n",piVar3 + val._4_4_,piVar4 + val._4_4_,
                            pdVar5 + val._4_4_);
            piVar3[val._4_4_] = piVar3[val._4_4_] + -1;
            piVar4[val._4_4_] = piVar4[val._4_4_] + -1;
          }
          fclose(_M);
          fname_local._4_4_ = 0;
        }
        else {
          fprintf(_stderr,"read_unsymmetric_sparse(): could not parse matrix size.\n");
          fname_local._4_4_ = -1;
        }
      }
      else {
        fprintf(_stderr,"Sorry, this application does not support ");
        __stream = _stderr;
        pcVar2 = mm_typecode_to_str((char *)&N);
        fprintf(__stream,"Market Market type: [%s]\n",pcVar2);
        fname_local._4_4_ = -1;
      }
    }
    else {
      printf("mm_read_unsymetric: Could not process Matrix Market banner ");
      printf(" in file [%s]\n",fname);
      fname_local._4_4_ = -1;
    }
  }
  return fname_local._4_4_;
}

Assistant:

int mm_read_unsymmetric_sparse(const char *fname, int *M_, int *N_, int *nz_,
                               double **val_, int **I_, int **J_) {
    FILE *f;
    MM_typecode matcode;
    int M, N, nz;
    int i;
    double *val;
    int *I, *J;

    if ((f = fopen(fname, "r")) == NULL)
        return -1;


    if (mm_read_banner(f, &matcode) != 0) {
        printf("mm_read_unsymetric: Could not process Matrix Market banner ");
        printf(" in file [%s]\n", fname);
        return -1;
    }


    if (!(mm_is_real(matcode) && mm_is_matrix(matcode) &&
          mm_is_sparse(matcode))) {
        fprintf(stderr, "Sorry, this application does not support ");
        fprintf(stderr, "Market Market type: [%s]\n",
                mm_typecode_to_str(matcode));
        return -1;
    }

    /* find out size of sparse matrix: M, N, nz .... */

    if (mm_read_mtx_crd_size(f, &M, &N, &nz) != 0) {
        fprintf(stderr, "read_unsymmetric_sparse(): could not parse matrix size.\n");
        return -1;
    }

    *M_ = M;
    *N_ = N;
    *nz_ = nz;

    /* reseve memory for matrices */

    I = (int *) malloc(nz * sizeof(int));
    J = (int *) malloc(nz * sizeof(int));
    val = (double *) malloc(nz * sizeof(double));

    *val_ = val;
    *I_ = I;
    *J_ = J;

    /* NOTE: when reading in doubles, ANSI C requires the use of the "l"  */
    /*   specifier as in "%lg", "%lf", "%le", otherwise errors will occur */
    /*  (ANSI C X3.159-1989, Sec. 4.9.6.2, p. 136 lines 13-15)            */

    for (i = 0; i < nz; i++) {
        fscanf(f, "%d %d %lg\n", &I[i], &J[i], &val[i]);
        I[i]--;  /* adjust from 1-based to 0-based */
        J[i]--;
    }
    fclose(f);

    return 0;
}